

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object.hpp
# Opt level: O0

Boxed_Value * __thiscall
chaiscript::dispatch::Dynamic_Object::method_missing(Dynamic_Object *this,string *t_method_name)

{
  undefined8 uVar1;
  Boxed_Value *pBVar2;
  long in_RDI;
  string *in_stack_00000018;
  option_explicit_set *in_stack_00000020;
  string *in_stack_ffffffffffffffb8;
  Dynamic_Object *in_stack_ffffffffffffffc0;
  bool local_2d;
  _Self local_20;
  _Self local_18 [3];
  
  local_2d = false;
  if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
    local_18[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                 *)in_stack_ffffffffffffffb8,(key_type *)0x35a917);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                *)in_stack_ffffffffffffffb8);
    local_2d = std::operator==(local_18,&local_20);
  }
  if (local_2d == false) {
    pBVar2 = get_attr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    return pBVar2;
  }
  uVar1 = __cxa_allocate_exception(0x10);
  option_explicit_set::option_explicit_set(in_stack_00000020,in_stack_00000018);
  __cxa_throw(uVar1,&option_explicit_set::typeinfo,option_explicit_set::~option_explicit_set);
}

Assistant:

Boxed_Value &method_missing(const std::string &t_method_name)
        {
          if (m_option_explicit && m_attrs.find(t_method_name) == m_attrs.end()) {
            throw option_explicit_set(t_method_name);
          }

          return get_attr(t_method_name);
        }